

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cc
# Opt level: O0

void __thiscall
TestSchema::readNestedRecord<avro::Parser<avro::ReaderImpl<avro::NullValidator>>>
          (TestSchema *this,Parser<avro::ReaderImpl<avro::NullValidator>_> *p)

{
  bool bVar1;
  ostream *poVar2;
  Parser<avro::ReaderImpl<avro::NullValidator>_> *in_RSI;
  const_string *in_RDI;
  float f;
  basic_cstring<const_char> *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  const_string *in_stack_ffffffffffffff88;
  unit_test_log_t *in_stack_ffffffffffffff90;
  undefined1 local_60 [56];
  basic_cstring<const_char> local_28;
  float local_14;
  Parser<avro::ReaderImpl<avro::NullValidator>_> *local_10;
  
  local_10 = in_RSI;
  printNext((TestSchema *)in_RDI,in_RSI);
  avro::Parser<avro::ReaderImpl<avro::NullValidator>_>::readRecord
            ((Parser<avro::ReaderImpl<avro::NullValidator>_> *)0x2b209e);
  printNext((TestSchema *)in_RDI,local_10);
  local_14 = avro::Parser<avro::ReaderImpl<avro::NullValidator>_>::readFloat
                       ((Parser<avro::ReaderImpl<avro::NullValidator>_> *)in_stack_ffffffffffffff40)
  ;
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,local_14);
  std::operator<<(poVar2,'\n');
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
               ,0x6b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffff40);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),in_RDI);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffff48,(char (*) [1])in_stack_ffffffffffffff40);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&stack0xffffffffffffff90,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
               ,0x6b);
    in_stack_ffffffffffffff80 = 0xc2ca33b6;
    in_stack_ffffffffffffff48 = "-101.101f";
    in_stack_ffffffffffffff40 = (basic_cstring<const_char> *)&stack0xffffffffffffff80;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,float,float>
              (local_60,&stack0xffffffffffffff90,0x148,1,2,&local_14,"f");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x2b21d2);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  avro::Parser<avro::ReaderImpl<avro::NullValidator>_>::readRecordEnd
            ((Parser<avro::ReaderImpl<avro::NullValidator>_> *)0x2b21ec);
  return;
}

Assistant:

void readNestedRecord(Parser &p)
    {
        printNext(p);
        p.readRecord();
        printNext(p);
        float f = p.readFloat();
        std::cout << f << '\n';
        BOOST_CHECK_EQUAL(f, -101.101f);
        p.readRecordEnd();
    }